

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void PropagateFlags(ParseNode *pnodeChild,ParseNode *pnodeParent)

{
  byte *pbVar1;
  uint uVar2;
  ParseNodeStmt *pPVar3;
  
  uVar2 = pnodeChild->nop - 0x5b;
  if (uVar2 < 0x15) {
    if ((0x1af2ffU >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x50c00U >> (uVar2 & 0x1f) & 1) == 0) {
        return;
      }
    }
    else {
      pPVar3 = ParseNode::AsParseNodeStmt(pnodeChild);
      if ((pPVar3->grfnop & 0x200) == 0) {
        return;
      }
    }
    pPVar3 = ParseNode::AsParseNodeStmt(pnodeParent);
    pbVar1 = (byte *)((long)&pPVar3->grfnop + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  return;
}

Assistant:

bool IsJump(ParseNode *pnode)
{
    switch (pnode->nop)
    {
    case knopBreak:
    case knopContinue:
    case knopThrow:
    case knopReturn:
        return true;

    case knopBlock:
    case knopDoWhile:
    case knopWhile:
    case knopWith:
    case knopIf:
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
    case knopFor:
    case knopSwitch:
    case knopCase:
    case knopTryFinally:
    case knopTryCatch:
    case knopTry:
    case knopCatch:
    case knopFinally:
        return (pnode->AsParseNodeStmt()->grfnop & fnopJump) != 0;

    default:
        return false;
    }
}